

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytes.cc
# Opt level: O3

t_object * xemmai::t_bytes::f_instantiate(size_t a_size)

{
  t_heap<xemmai::t_object> *this;
  t_type *ptVar1;
  t_queue<128UL> *this_00;
  t_queue<256UL> *this_01;
  t_object *ptVar2;
  t_object *ptVar3;
  long in_FS_OFFSET;
  
  ptVar1 = *(t_type **)(*(long *)(in_FS_OFFSET + -0x78) + 0x1e8);
  this = (t_heap<xemmai::t_object> *)(*(long *)(in_FS_OFFSET + -0x60) + 0x30);
  if (a_size + 0x50 < 0x81) {
    ptVar3 = *(t_object **)(in_FS_OFFSET + -0x58);
    if (ptVar3 == (t_object *)0x0) {
      ptVar3 = t_heap<xemmai::t_object>::t_of<0UL,_65536UL>::f_allocate
                         ((t_of<0UL,_65536UL> *)(*(long *)(in_FS_OFFSET + -0x60) + 0x90),this);
      ptVar2 = ptVar3->v_next;
    }
    else {
      ptVar2 = ptVar3->v_next;
    }
    *(t_object **)(in_FS_OFFSET + -0x58) = ptVar2;
  }
  else {
    ptVar3 = t_heap<xemmai::t_object>::f_allocate_medium(this,a_size + 0x50);
  }
  ptVar3->v_next = (t_object *)0x0;
  *(size_t *)ptVar3->v_data = a_size;
  this_00 = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
  *this_00->v_head = (t_object *)&ptVar1[-1].f_less;
  if (this_00->v_head == this_00->v_next) {
    t_slot::t_queue<128UL>::f_next(this_00);
  }
  else {
    this_00->v_head = this_00->v_head + 1;
  }
  ptVar3->v_type = ptVar1;
  this_01 = *(t_queue<256UL> **)(in_FS_OFFSET + -0x70);
  *this_01->v_head = ptVar3;
  if (this_01->v_head == this_01->v_next) {
    t_slot::t_queue<256UL>::f_next(this_01);
  }
  else {
    this_01->v_head = this_01->v_head + 1;
  }
  return ptVar3;
}

Assistant:

t_object* t_bytes::f_instantiate(size_t a_size)
{
	return t_type_of<t_bytes>::f__construct(f_global()->f_type<t_bytes>(), a_size);
}